

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_worker-inl.h
# Opt level: O2

void __thiscall spdlog::details::periodic_worker::~periodic_worker(periodic_worker *this)

{
  if (*(long *)(this + 8) != 0) {
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x10))->__data);
    *this = (periodic_worker)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x10));
    std::condition_variable::notify_one();
    std::thread::join();
  }
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x38));
  std::thread::~thread((thread *)(this + 8));
  return;
}

Assistant:

SPDLOG_INLINE periodic_worker::~periodic_worker()
{
    if (worker_thread_.joinable())
    {
        {
            std::lock_guard<std::mutex> lock(mutex_);
            active_ = false;
        }
        cv_.notify_one();
        worker_thread_.join();
    }
}